

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O2

int count_mora_in_accent_phrase(JPCommonLabelMora *m)

{
  _JPCommonLabelAccentPhrase *p_Var1;
  int iVar2;
  _JPCommonLabelWord *p_Var3;
  
  p_Var1 = m->up->up;
  p_Var3 = p_Var1->head;
  iVar2 = 0;
  do {
    p_Var3 = (_JPCommonLabelWord *)p_Var3->head;
    if (p_Var3 == (_JPCommonLabelWord *)0x0) {
      return iVar2;
    }
    iVar2 = iVar2 + 1;
  } while (p_Var3 != (_JPCommonLabelWord *)p_Var1->tail->tail);
  return iVar2;
}

Assistant:

static int count_mora_in_accent_phrase(JPCommonLabelMora * m)
{
   int i;
   JPCommonLabelMora *index;

   for (i = 0, index = m->up->up->head->head; index != NULL; index = index->next) {
      i++;
      if (index == m->up->up->tail->tail)
         break;
   }
   return i;
}